

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool fileExists(string *filename)

{
  int iVar1;
  bool bVar2;
  string delims;
  string rtrimmed;
  string ftrimmed;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40 [2];
  char local_30 [16];
  
  iVar1 = access((filename->_M_dataplus)._M_p,0);
  bVar2 = true;
  if (iVar1 == -1) {
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80," \f\n\r\t\v","");
    std::__cxx11::string::find_last_not_of((char *)filename,(ulong)local_80[0],0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_60,(ulong)filename);
    std::__cxx11::string::find_first_not_of((char *)local_60,(ulong)local_80[0],0);
    std::__cxx11::string::substr((ulong)local_40,(ulong)local_60);
    iVar1 = access(local_40[0],0);
    bVar2 = iVar1 != -1;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
  }
  return bVar2;
}

Assistant:

bool fileExists(const std::string& filename)
{
    if (access( filename.c_str(), F_OK ) != -1)
    {
        return true; // file exists
    }
    else
    {
        //std::cout << "access(filename) returned -1 on filename [" << filename << "] I will try trimming." << std::endl;
        std::string delims = " \f\n\r\t\v";
        std::string rtrimmed = filename.substr(0, filename.find_last_not_of(delims) + 1);
        std::string ftrimmed = rtrimmed.substr(rtrimmed.find_first_not_of(delims));
        if (access( ftrimmed.c_str(), F_OK ) != -1)
        {
            return true;
        }
        else
        {
            //std::cout << "Still failed. Cannot find the specified file." << std::endl;
            return false;// file doesn't exist
        }
    }
}